

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_wav_init_memory_ex
                    (ma_dr_wav *pWav,void *data,size_t dataSize,ma_dr_wav_chunk_proc onChunk,
                    void *pChunkUserData,ma_uint32 flags,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  
  if (dataSize != 0 && data != (void *)0x0) {
    mVar1 = ma_dr_wav_preinit(pWav,ma_dr_wav__on_read_memory,ma_dr_wav__on_seek_memory,pWav,
                              pAllocationCallbacks);
    if (mVar1 != 0) {
      (pWav->memoryStream).data = (ma_uint8 *)data;
      (pWav->memoryStream).dataSize = dataSize;
      (pWav->memoryStream).currentReadPos = 0;
      mVar1 = ma_dr_wav_init__internal(pWav,onChunk,pChunkUserData,flags);
      return mVar1;
    }
  }
  return 0;
}

Assistant:

MA_API ma_bool32 ma_dr_wav_init_memory_ex(ma_dr_wav* pWav, const void* data, size_t dataSize, ma_dr_wav_chunk_proc onChunk, void* pChunkUserData, ma_uint32 flags, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (data == NULL || dataSize == 0) {
        return MA_FALSE;
    }
    if (!ma_dr_wav_preinit(pWav, ma_dr_wav__on_read_memory, ma_dr_wav__on_seek_memory, pWav, pAllocationCallbacks)) {
        return MA_FALSE;
    }
    pWav->memoryStream.data = (const ma_uint8*)data;
    pWav->memoryStream.dataSize = dataSize;
    pWav->memoryStream.currentReadPos = 0;
    return ma_dr_wav_init__internal(pWav, onChunk, pChunkUserData, flags);
}